

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O1

void __thiscall DBaseStatusBar::BlendView(DBaseStatusBar *this,float *blend)

{
  player_t *ppVar1;
  bool bVar2;
  AActor *pAVar3;
  player_t **pppVar4;
  
  V_AddBlend((float)BaseBlendR / 255.0,(float)BaseBlendG / 255.0,(float)BaseBlendB / 255.0,
             BaseBlendA * underwater_fade_scalar.Value,blend);
  pppVar4 = &this->CPlayer;
  V_AddPlayerBlend(this->CPlayer,blend,1.0,0xe4);
  if (screen->Accel2D == false) {
    pAVar3 = ((*pppVar4)->camera).field_0.p;
    if (pAVar3 == (AActor *)0x0) {
LAB_004d3029:
      bVar2 = false;
    }
    else {
      bVar2 = true;
      if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
        ((*pppVar4)->camera).field_0.p = (AActor *)0x0;
        goto LAB_004d3029;
      }
    }
    if (((!bVar2) || (menuactive != MENU_Off)) || (ConsoleState != c_up)) goto LAB_004d30df;
  }
  pAVar3 = ((*pppVar4)->camera).field_0.p;
  if (pAVar3 != (AActor *)0x0) {
    if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if ((((*pppVar4)->camera).field_0.p)->player != (player_t *)0x0) {
        pAVar3 = ((*pppVar4)->camera).field_0.p;
        if ((pAVar3 != (AActor *)0x0) &&
           (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          ((*pppVar4)->camera).field_0.p = (AActor *)0x0;
          pAVar3 = (AActor *)0x0;
        }
        pppVar4 = &pAVar3->player;
      }
    }
    else {
      ((*pppVar4)->camera).field_0.p = (AActor *)0x0;
    }
  }
  ppVar1 = *pppVar4;
  V_AddBlend(ppVar1->BlendR,ppVar1->BlendG,ppVar1->BlendB,ppVar1->BlendA,blend);
LAB_004d30df:
  V_SetBlend((int)(*blend * 255.0),(int)(blend[1] * 255.0),(int)(blend[2] * 255.0),
             (int)(blend[3] * 256.0));
  return;
}

Assistant:

void DBaseStatusBar::BlendView (float blend[4])
{
	// [Nash] Allow user to set blend intensity
	float cnt = (BaseBlendA * underwater_fade_scalar);

	V_AddBlend (BaseBlendR / 255.f, BaseBlendG / 255.f, BaseBlendB / 255.f, cnt, blend);
	V_AddPlayerBlend(CPlayer, blend, 1.0f, 228);

	if (screen->Accel2D || (CPlayer->camera != NULL && menuactive == MENU_Off && ConsoleState == c_up))
	{
		player_t *player = (CPlayer->camera != NULL && CPlayer->camera->player != NULL) ? CPlayer->camera->player : CPlayer;
		V_AddBlend (player->BlendR, player->BlendG, player->BlendB, player->BlendA, blend);
	}

	V_SetBlend ((int)(blend[0] * 255.0f), (int)(blend[1] * 255.0f),
				(int)(blend[2] * 255.0f), (int)(blend[3] * 256.0f));
}